

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_5f851::MapDrivePlugIn::redraw
          (MapDrivePlugIn *this,float currentTime,float elapsedTime)

{
  size_type segmentIndex;
  MapDriver *pMVar1;
  Color CVar2;
  MapDrivePlugIn *pMVar3;
  bool bVar4;
  TerrainMap *pTVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar6;
  ulong uVar7;
  ostringstream *status_00;
  ostringstream *status_01;
  ostringstream *status_02;
  ostringstream *status_03;
  Color *color_00;
  long lVar8;
  ulong uVar9;
  int iVar10;
  char *pcVar11;
  Color *in_R9;
  int iVar12;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float extraout_XMM0_Da_05;
  float extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  Vec3 location;
  Color pathColor;
  Color sandColor;
  Color color;
  ostringstream status;
  Color local_280;
  Color local_270;
  float local_25c;
  float local_258;
  float fStack_254;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_22c;
  Color local_228;
  Vec3 local_218;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  float local_1e4;
  MapDrivePlugIn *local_1e0;
  undefined1 local_1d8 [16];
  Vec3 local_1c8;
  Vec3 local_1b8;
  Color local_1a8 [7];
  ios_base local_138 [264];
  
  local_228.a_ = local_228.g_;
  OpenSteer::OpenSteerDemo::updateCamera(currentTime,elapsedTime,(AbstractVehicle *)this->vehicle);
  local_228.b_ = 400.0;
  local_228.r_ = 400.0;
  local_228.g_ = -0.2;
  local_280.r_ = 400.0;
  local_280.g_ = -0.2;
  local_280.b_ = -400.0;
  local_270.r_ = -400.0;
  local_270.g_ = -0.2;
  local_270.b_ = -400.0;
  local_218.x = -400.0;
  local_218.y = -0.2;
  local_218.z = 400.0;
  fVar13 = 0.7;
  OpenSteer::Color::Color(local_1a8,0.8,0.7,0.5,1.0);
  OpenSteer::drawQuadrangle
            ((OpenSteer *)&local_228,(Vec3 *)&local_280,(Vec3 *)&local_270,&local_218,
             (Vec3 *)local_1a8,in_R9);
  pMVar1 = this->vehicle;
  pTVar5 = pMVar1->map;
  local_1e0 = this;
  if (0 < pTVar5->resolution) {
    local_22c = pTVar5->xSize;
    local_1e4 = (float)pTVar5->resolution;
    fVar13 = local_22c / local_1e4;
    local_1e4 = pTVar5->zSize / local_1e4;
    fVar15 = (pTVar5->center).x - (local_22c - fVar13) * 0.5;
    fVar16 = (pTVar5->center).y;
    fVar14 = (pTVar5->center).z - (pTVar5->zSize - local_1e4) * 0.5;
    _local_208 = ZEXT416((uint)fVar13);
    fVar13 = fVar13 * 0.5;
    local_25c = local_1e4 * 0.5;
    local_1f8 = ZEXT416((uint)fVar13);
    local_1d8 = ZEXT416((uint)fVar13);
    iVar12 = 0;
    fVar17 = 0.0;
    do {
      fVar16 = fVar16 + 0.0;
      pTVar5 = pMVar1->map;
      iVar10 = pTVar5->resolution;
      if (0 < iVar10) {
        lVar8 = 0;
        fVar18 = fVar17;
        do {
          uVar7 = lVar8 + iVar10 * iVar12;
          uVar9 = lVar8 + 0x3f + (long)(iVar10 * iVar12);
          if (-1 < (long)uVar7) {
            uVar9 = uVar7;
          }
          if (((pTVar5->map).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [((long)uVar9 >> 6) +
                (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
               (uVar7 & 0x3f) & 1) != 0) {
            local_258 = fVar14;
            local_248 = fVar15;
            fStack_244 = fVar16;
            fStack_240 = fVar17;
            fStack_23c = fVar18;
            OpenSteer::Color::Color(local_1a8,0.5,0.2,0.0,1.0);
            CVar2 = local_228;
            local_280.r_ = (float)local_1d8._0_4_ + local_248;
            local_280.g_ = (float)local_1d8._4_4_ + fStack_244;
            fVar13 = local_25c + local_258;
            local_228.g_ = local_280.g_;
            local_228.r_ = local_280.r_;
            local_228.a_ = CVar2.a_;
            local_228.b_ = fVar13;
            local_280.b_ = local_258 - local_25c;
            local_270.r_ = local_248 - (float)local_1f8._0_4_;
            local_218.y = local_280.g_;
            local_218.x = local_270.r_;
            local_270.g_ = local_280.g_;
            local_270.b_ = local_280.b_;
            local_218.z = fVar13;
            OpenSteer::drawQuadrangle
                      ((OpenSteer *)&local_228,(Vec3 *)&local_280,(Vec3 *)&local_270,&local_218,
                       (Vec3 *)local_1a8,in_R9);
            fVar14 = local_258;
            fVar15 = local_248;
            fVar16 = fStack_244;
            fVar17 = fStack_240;
            fVar18 = fStack_23c;
          }
          fVar15 = fVar15 + (float)local_208._0_4_;
          fVar16 = fVar16 + (float)local_208._4_4_;
          fVar17 = fVar17 + fStack_200;
          fVar18 = fVar18 + fStack_1fc;
          fVar14 = fVar14 + 0.0;
          pTVar5 = pMVar1->map;
          iVar10 = pTVar5->resolution;
          lVar8 = lVar8 + 1;
        } while ((int)lVar8 < iVar10);
      }
      fVar15 = fVar15 - local_22c;
      fVar14 = fVar14 + local_1e4;
      iVar12 = iVar12 + 1;
      fVar17 = fVar16;
    } while (iVar12 < pMVar1->map->resolution);
  }
  if ((anonymous_namespace)::MapDriver::demoSelect == 2) {
    pMVar1 = local_1e0->vehicle;
    OpenSteer::Color::Color(&local_280,0.0,0.5,0.5,1.0);
    OpenSteer::Color::Color(&local_270,0.8,0.7,0.5,1.0);
    local_228 = OpenSteer::operator-(&local_280,&local_270);
    local_1a8[0] = OpenSteer::operator*(&local_228,0.1);
    local_1a8[0] = OpenSteer::operator+(&local_270,local_1a8);
    fVar13 = local_1a8[0].b_;
    iVar12 = (*(pMVar1->path->super_SegmentedPathway).super_Pathway._vptr_Pathway[8])();
    if (1 < CONCAT44(extraout_var,iVar12)) {
      uVar9 = 1;
      do {
        (*(pMVar1->path->super_SegmentedPathway).super_Pathway._vptr_Pathway[9])(pMVar1->path,uVar9)
        ;
        CVar2 = local_228;
        fVar13 = fVar13 + 0.0;
        local_228.g_ = extraout_XMM0_Db + -0.1;
        local_228.r_ = extraout_XMM0_Da + 0.0;
        local_228.a_ = CVar2.a_;
        local_228.b_ = fVar13;
        segmentIndex = uVar9 - 1;
        (*(pMVar1->path->super_SegmentedPathway).super_Pathway._vptr_Pathway[9])
                  (pMVar1->path,segmentIndex);
        fVar13 = fVar13 + 0.0;
        local_218.y = extraout_XMM0_Db_00 + -0.1;
        local_218.x = extraout_XMM0_Da_00 + 0.0;
        local_218.z = fVar13;
        local_258 = OpenSteer::PolylineSegmentedPathwaySegmentRadii::segmentRadius
                              (pMVar1->path,segmentIndex);
        OpenSteer::drawXZWideLine((Vec3 *)&local_228,&local_218,local_1a8,local_258 + local_258);
        (*(pMVar1->path->super_SegmentedPathway).super_Pathway._vptr_Pathway[9])(pMVar1->path,uVar9)
        ;
        local_1b8.z = fVar13;
        (*(pMVar1->path->super_SegmentedPathway).super_Pathway._vptr_Pathway[9])
                  (pMVar1->path,segmentIndex);
        local_1c8.z = fVar13;
        OpenSteer::drawLine(&local_1b8,&local_1c8,&local_280);
        if (OpenSteer::updatePhaseActive == '\x01') {
          OpenSteer::warnIfInUpdatePhase2("drawXZDisk");
        }
        OpenSteer::drawXZCircleOrDisk(local_258,(Vec3 *)&local_228,local_1a8,0x18,true);
        if (OpenSteer::updatePhaseActive == '\x01') {
          OpenSteer::warnIfInUpdatePhase2("drawXZDisk");
        }
        OpenSteer::drawXZCircleOrDisk(local_258,&local_218,local_1a8,0x18,true);
        iVar12 = (*(pMVar1->path->super_SegmentedPathway).super_Pathway._vptr_Pathway[8])();
        uVar9 = uVar9 + 1;
      } while (uVar9 < CONCAT44(extraout_var_00,iVar12));
    }
  }
  pMVar3 = local_1e0;
  pMVar1 = local_1e0->vehicle;
  local_1a8[0].b_ = (float)OpenSteer::gBlack._8_4_;
  local_1a8[0].a_ = (float)OpenSteer::gBlack._12_4_;
  local_1a8[0].r_ = (float)OpenSteer::gBlack._0_4_;
  local_1a8[0].g_ = (float)OpenSteer::gBlack._4_4_;
  if (pMVar1->stuck == true) {
    local_1a8[0].b_ = (float)OpenSteer::gYellow._8_4_;
    local_1a8[0].a_ = (float)OpenSteer::gYellow._12_4_;
    local_1a8[0].r_ = (float)OpenSteer::gYellow._0_4_;
    local_1a8[0].g_ = (float)OpenSteer::gYellow._4_4_;
  }
  bVar4 = MapDriver::bodyInsidePath(pMVar1);
  if (!bVar4) {
    local_1a8[0].g_ = (float)OpenSteer::gOrange._4_4_;
    local_1a8[0].r_ = (float)OpenSteer::gOrange._0_4_;
    local_1a8[0].b_ = (float)OpenSteer::gOrange._8_4_;
    local_1a8[0].a_ = (float)OpenSteer::gOrange._12_4_;
  }
  if (pMVar1->collisionDetected == true) {
    local_1a8[0].g_ = (float)OpenSteer::gRed._4_4_;
    local_1a8[0].r_ = (float)OpenSteer::gRed._0_4_;
    local_1a8[0].b_ = (float)OpenSteer::gRed._8_4_;
    local_1a8[0].a_ = (float)OpenSteer::gRed._12_4_;
  }
  (*(pMVar1->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[8])(pMVar1);
  local_208._0_4_ = fVar13;
  local_258 = extraout_XMM0_Da_01;
  fStack_254 = extraout_XMM0_Db_01;
  (*(pMVar1->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[2])(pMVar1);
  local_1f8 = ZEXT416((uint)pMVar1->halfWidth);
  fVar13 = fVar13 * pMVar1->halfWidth;
  local_25c = fVar13;
  local_248 = extraout_XMM0_Da_02;
  fStack_244 = extraout_XMM0_Db_02;
  (*(pMVar1->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[6])(pMVar1);
  CVar2 = local_228;
  fVar16 = pMVar1->halfLength;
  fVar17 = (float)local_208._0_4_ - fVar13 * fVar16;
  local_248 = (float)local_1f8._0_4_ * local_248;
  fStack_244 = (float)local_1f8._0_4_ * fStack_244;
  fVar14 = local_258 - fVar16 * extraout_XMM0_Da_03;
  fVar15 = fStack_254 - fVar16 * extraout_XMM0_Db_03;
  local_228.g_ = fStack_244 + fVar15 + 0.1;
  local_228.r_ = local_248 + fVar14 + 0.0;
  local_228.a_ = CVar2.a_;
  local_228.b_ = local_25c + fVar17 + 0.0;
  fVar13 = fVar13 * fVar16 + (float)local_208._0_4_;
  local_258 = fVar16 * extraout_XMM0_Da_03 + local_258;
  fStack_254 = fVar16 * extraout_XMM0_Db_03 + fStack_254;
  local_280.r_ = local_248 + local_258 + 0.0;
  local_280.g_ = fStack_244 + fStack_254 + 0.1;
  local_280.b_ = local_25c + fVar13 + 0.0;
  local_270.r_ = (local_258 - local_248) + 0.0;
  local_270.g_ = (fStack_254 - fStack_244) + 0.1;
  local_270.b_ = (fVar13 - local_25c) + 0.0;
  local_218.z = (fVar17 - local_25c) + 0.0;
  local_218.y = (fVar15 - fStack_244) + 0.1;
  local_218.x = (fVar14 - local_248) + 0.0;
  OpenSteer::drawQuadrangle
            ((OpenSteer *)&local_228,(Vec3 *)&local_280,(Vec3 *)&local_270,&local_218,
             (Vec3 *)local_1a8,in_R9);
  OpenSteer::Color::Color(&local_228,0.0,0.6,0.0,1.0);
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::drawTrail
            ((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)pMVar1,
             &local_228,(Color *)OpenSteer::gBlack);
  local_1a8[0]._0_12_ = ZEXT812(0x40000000);
  local_228._0_12_ = ZEXT812(0xc0000000);
  OpenSteer::drawLine((Vec3 *)local_1a8,(Vec3 *)&local_228,(Color *)OpenSteer::gGreen);
  local_1a8[0]._0_12_ = ZEXT412(0x40000000) << 0x40;
  local_228._0_12_ = ZEXT412(0xc0000000) << 0x40;
  OpenSteer::drawLine((Vec3 *)local_1a8,(Vec3 *)&local_228,(Color *)OpenSteer::gGreen);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Speed: ",7);
  (*(pMVar3->vehicle->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x1b])();
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(int)extraout_XMM0_Da_04);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," mps (",6);
  (*(pMVar3->vehicle->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x1b])();
  poVar6 = (ostream *)
           std::ostream::operator<<((ostream *)poVar6,(int)(extraout_XMM0_Da_05 / 0.44704));
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," mph)",5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", average: ",0xb);
  lVar8 = *(long *)poVar6;
  *(undefined8 *)(poVar6 + *(long *)(lVar8 + -0x18) + 8) = 1;
  *(uint *)(poVar6 + *(long *)(lVar8 + -0x18) + 0x18) =
       *(uint *)(poVar6 + *(long *)(lVar8 + -0x18) + 0x18) | 4;
  poVar6 = std::ostream::_M_insert<double>
                     ((double)(pMVar3->vehicle->totalDistance / pMVar3->vehicle->totalTime));
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," mps\n\n",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"collisions avoided for ",0x17);
  poVar6 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)local_1a8,
                      (int)(OpenSteer::OpenSteerDemo::clock.totalSimulationTime -
                           pMVar3->vehicle->timeOfLastCollision));
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," seconds",8);
  if (0 < pMVar3->vehicle->countOfCollisionFreeTimes) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\nmean time between collisions: ",0x1f);
    poVar6 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)local_1a8,
                        (int)(pMVar3->vehicle->sumOfCollisionFreeTimes /
                             (float)pMVar3->vehicle->countOfCollisionFreeTimes));
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," (",2);
    poVar6 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar6,(int)pMVar3->vehicle->sumOfCollisionFreeTimes);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"/",1);
    poVar6 = (ostream *)
             std::ostream::operator<<((ostream *)poVar6,pMVar3->vehicle->countOfCollisionFreeTimes);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n\nStuck count: ",0xf);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,pMVar3->vehicle->stuckCount);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," (",2);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,pMVar3->vehicle->stuckCycleCount);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," cycles, ",9);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,pMVar3->vehicle->stuckOffPathCount)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," off path)",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n\n[F1] ",7);
  if ((anonymous_namespace)::MapDriver::demoSelect == 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"wander, ",8);
  }
  if ((anonymous_namespace)::MapDriver::demoSelect == 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"follow path, ",0xd);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"avoid obstacle",0xe);
  if ((anonymous_namespace)::MapDriver::demoSelect == 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\n[F2] path following direction: ",0x20);
    pcVar11 = "-1";
    if (0 < pMVar3->vehicle->pathFollowDirection) {
      pcVar11 = "+1";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\n[F3] path fence: ",0x12);
    pcVar11 = "off";
    if ((ulong)pMVar3->usePathFences != 0) {
      pcVar11 = "on";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,pcVar11,(ulong)pMVar3->usePathFences ^ 3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n[F4] rocks: ",0xd);
  pcVar11 = "off";
  if ((ulong)pMVar3->useRandomRocks != 0) {
    pcVar11 = "on";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,pcVar11,(ulong)pMVar3->useRandomRocks ^ 3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\n[F5] prediction: ",0x12);
  pcVar11 = "linear";
  if (pMVar3->vehicle->curvedSteering != false) {
    pcVar11 = "curved";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,6);
  if ((anonymous_namespace)::MapDriver::demoSelect == 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n\nLap ",6);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,pMVar3->vehicle->lapsStarted);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," (completed: ",0xd);
    iVar12 = pMVar3->vehicle->lapsStarted;
    iVar10 = 0;
    if (1 < iVar12) {
      iVar10 = (int)(((float)pMVar3->vehicle->lapsFinished / (float)(iVar12 + -1)) * 100.0);
    }
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"%)",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\nHints given: ",0xe);
    poVar6 = (ostream *)
             std::ostream::operator<<((ostream *)local_1a8,pMVar3->vehicle->hintGivenCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,", taken: ",9);
    std::ostream::operator<<((ostream *)poVar6,pMVar3->vehicle->hintTakenCount);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  qqqRange((MapDrivePlugIn *)"WR ",(char *)local_1a8,
           (anonymous_namespace)::MapDriver::savedNearestWR,status_00);
  qqqRange((MapDrivePlugIn *)"R  ",(char *)local_1a8,(anonymous_namespace)::MapDriver::savedNearestR
           ,status_01);
  qqqRange((MapDrivePlugIn *)"L  ",(char *)local_1a8,(anonymous_namespace)::MapDriver::savedNearestL
           ,status_02);
  qqqRange((MapDrivePlugIn *)"WL ",(char *)local_1a8,
           (anonymous_namespace)::MapDriver::savedNearestWL,status_03);
  std::ostream::put((char)local_1a8);
  local_258 = OpenSteer::drawGetWindowHeight();
  OpenSteer::Color::Color(&local_228,0.15,0.15,0.5,1.0);
  local_248 = OpenSteer::drawGetWindowWidth();
  fVar13 = OpenSteer::drawGetWindowHeight();
  location.y = local_258 + -50.0;
  location.x = 10.0;
  location.z = 0.0;
  OpenSteer::draw2dTextAt2dLocation
            ((OpenSteer *)local_1a8,(ostringstream *)&local_228,location,color_00,local_248,fVar13);
  local_258 = OpenSteer::drawGetWindowWidth();
  pMVar1 = pMVar3->vehicle;
  (*(pMVar1->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x1b])(pMVar1);
  local_25c = extraout_XMM0_Da_06;
  (*(pMVar1->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x20])(pMVar1);
  local_1d8._0_4_ = extraout_XMM0_Da_07;
  local_248 = local_258 + -20.0;
  fVar13 = pMVar3->vehicle->annoteMaxRelSpeed;
  local_280.r_ = local_248 * fVar13 + 10.0;
  local_280.g_ = 2.0;
  local_280.b_ = 0.0;
  local_270.g_ = 8.0;
  local_270.b_ = 0.0;
  local_270.r_ = local_280.r_;
  local_1f8._0_4_ = fVar13;
  fVar13 = OpenSteer::drawGetWindowWidth();
  local_208._0_4_ = fVar13;
  fVar13 = OpenSteer::drawGetWindowHeight();
  OpenSteer::draw2dLine
            ((Vec3 *)&local_280,(Vec3 *)&local_270,(Color *)OpenSteer::gBlack,(float)local_208._0_4_
             ,fVar13);
  if (((float)local_1f8._0_4_ != 0.0) || (NAN((float)local_1f8._0_4_))) {
    local_280.r_ = pMVar3->vehicle->annoteMaxRelSpeedCurve * local_248 + 10.0;
    local_1f8._0_4_ = pMVar3->vehicle->annoteMaxRelSpeedPath;
    local_280.g_ = 6.0;
    local_280.b_ = 0.0;
    local_270.r_ = local_258 + -10.0;
    local_270.g_ = 6.0;
    local_270.b_ = 0.0;
    local_22c = local_270.r_;
    local_208._0_4_ = OpenSteer::drawGetWindowWidth();
    fVar13 = OpenSteer::drawGetWindowHeight();
    OpenSteer::draw2dLine
              ((Vec3 *)&local_280,(Vec3 *)&local_270,(Color *)OpenSteer::gRed,(float)local_208._0_4_
               ,fVar13);
    local_280.r_ = (float)local_1f8._0_4_ * local_248 + 10.0;
    local_280.g_ = 3.0;
    local_280.b_ = 0.0;
    local_270.r_ = local_22c;
    local_270.g_ = 4.0;
    local_270.b_ = 0.0;
    local_208._0_4_ = OpenSteer::drawGetWindowWidth();
    fVar13 = OpenSteer::drawGetWindowHeight();
    OpenSteer::draw2dLine
              ((Vec3 *)&local_280,(Vec3 *)&local_270,(Color *)OpenSteer::gGreen,
               (float)local_208._0_4_,fVar13);
  }
  local_280.r_ = 10.0;
  local_280.g_ = 5.0;
  local_270.r_ = local_248 * (local_25c / (float)local_1d8._0_4_) + 10.0;
  local_280.b_ = 0.0;
  local_270.g_ = 5.0;
  local_270.b_ = 0.0;
  local_248 = OpenSteer::drawGetWindowWidth();
  fVar13 = OpenSteer::drawGetWindowHeight();
  OpenSteer::draw2dLine
            ((Vec3 *)&local_280,(Vec3 *)&local_270,(Color *)OpenSteer::gWhite,local_248,fVar13);
  local_280.r_ = 10.0;
  local_280.g_ = 5.0;
  local_280.b_ = 0.0;
  local_270.r_ = 10.0;
  local_270.g_ = 3.0;
  local_270.b_ = 0.0;
  local_248 = OpenSteer::drawGetWindowWidth();
  fVar13 = OpenSteer::drawGetWindowHeight();
  OpenSteer::draw2dLine
            ((Vec3 *)&local_280,(Vec3 *)&local_270,(Color *)OpenSteer::gWhite,local_248,fVar13);
  local_280.r_ = local_258 + -10.0;
  local_280.g_ = 5.0;
  local_280.b_ = 0.0;
  local_270.g_ = 3.0;
  local_270.b_ = 0.0;
  local_270.r_ = local_280.r_;
  local_258 = OpenSteer::drawGetWindowWidth();
  fVar13 = OpenSteer::drawGetWindowHeight();
  OpenSteer::draw2dLine
            ((Vec3 *)&local_280,(Vec3 *)&local_270,(Color *)OpenSteer::gWhite,local_258,fVar13);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void redraw (const float currentTime, const float elapsedTime)
        {
            // update camera, tracking test vehicle
            OpenSteerDemo::updateCamera (currentTime, elapsedTime, vehicle);

            // draw "ground plane"  (make it 4x map size)
            const float s = MapDriver::worldSize * 2;
            const float u = -0.2f;
            drawQuadrangle (Vec3 (+s, u, +s),
                            Vec3 (+s, u, -s),
                            Vec3 (-s, u, -s),
                            Vec3 (-s, u, +s),
                            Color (0.8f, 0.7f, 0.5f)); // "sand"

            // draw map and path
            vehicle->drawMap ();
            if (vehicle->demoSelect == 2) vehicle->drawPath ();

            // draw test vehicle
            vehicle->draw ();

            // QQQ mark origin to help spot artifacts
            const float tick = 2;
            drawLine (Vec3 (tick, 0, 0), Vec3 (-tick, 0, 0), gGreen);
            drawLine (Vec3 (0, 0, tick), Vec3 (0, 0, -tick), gGreen);

            // compute conversion factor miles-per-hour to meters-per-second
            const float metersPerMile = 1609.344f;
            const float secondsPerHour = 3600;
            const float MPSperMPH = metersPerMile / secondsPerHour;

            // display status in the upper left corner of the window
            std::ostringstream status;
            status << "Speed: "
                   << (int) vehicle->speed () << " mps ("
                   << (int) (vehicle->speed () / MPSperMPH) << " mph)"
                   << ", average: "
                   << std::setprecision (1) << std::setiosflags (std::ios::fixed)
                   << vehicle->totalDistance / vehicle->totalTime

                   << " mps\n\n";
            status << "collisions avoided for "
                   << (int)(OpenSteerDemo::clock.getTotalSimulationTime () -
                            vehicle->timeOfLastCollision)
                   << " seconds";
            if (vehicle->countOfCollisionFreeTimes > 0)
            {
                status << "\nmean time between collisions: "
                       << (int) (vehicle->sumOfCollisionFreeTimes /
                                 vehicle->countOfCollisionFreeTimes)
                       << " ("
                       << (int)vehicle->sumOfCollisionFreeTimes
                       << "/"
                       << (int)vehicle->countOfCollisionFreeTimes
                       << ")";
            }

            status << "\n\nStuck count: " << vehicle->stuckCount << " (" 
                   << vehicle->stuckCycleCount << " cycles, "
                   << vehicle->stuckOffPathCount << " off path)";
            status << "\n\n[F1] ";
            if (1 == vehicle->demoSelect) status << "wander, ";
            if (2 == vehicle->demoSelect) status << "follow path, ";
            status << "avoid obstacle";

            if (2 == vehicle->demoSelect)
            {
                status << "\n[F2] path following direction: ";
                if (vehicle->pathFollowDirection>0)status<<"+1";else status<<"-1";
                status << "\n[F3] path fence: ";
                if (usePathFences) status << "on"; else status << "off";
            }

            status << "\n[F4] rocks: ";
            if (useRandomRocks) status << "on"; else status << "off";
            status << "\n[F5] prediction: ";
            if (vehicle->curvedSteering)
                status << "curved"; else status << "linear";
            if (2 == vehicle->demoSelect)
            {
                status << "\n\nLap " << vehicle->lapsStarted
                       << " (completed: "
                       << ((vehicle->lapsStarted < 2) ? 0 :
                           (int) (100 * ((float) vehicle->lapsFinished /
                                         (float) (vehicle->lapsStarted - 1))))
                       << "%)";

                status << "\nHints given: " << vehicle->hintGivenCount
                       << ", taken: " << vehicle->hintTakenCount;
            }
            status << "\n";
            qqqRange ("WR ", vehicle->savedNearestWR, status);
            qqqRange ("R  ", vehicle->savedNearestR,  status);
            qqqRange ("L  ", vehicle->savedNearestL,  status);
            qqqRange ("WL ", vehicle->savedNearestWL, status);
            status << std::ends;
            const float h = drawGetWindowHeight ();
            const Vec3 screenLocation (10, h-50, 0);
            const Color color (0.15f, 0.15f, 0.5f);
            draw2dTextAt2dLocation (status, screenLocation, color, drawGetWindowWidth(), drawGetWindowHeight());

            {
                const float v = 5;
                const float m = 10;
                const float w = drawGetWindowWidth ();
                const float f = w - (2 * m);
                const float s = vehicle->relativeSpeed ();

                // limit tick mark
                const float l = vehicle->annoteMaxRelSpeed;
                draw2dLine (Vec3 (m+(f*l), v-3, 0), Vec3 (m+(f*l),v+3, 0), gBlack, drawGetWindowWidth(), drawGetWindowHeight());
                // two "inverse speedometers" showing limits due to curvature and
                // path alignment
                if (l!=0)
                {
                    const float c = vehicle->annoteMaxRelSpeedCurve;
                    const float p = vehicle->annoteMaxRelSpeedPath;
                    draw2dLine (Vec3(m+(f*c), v+1, 0), Vec3(w-m, v+1, 0), gRed, drawGetWindowWidth(), drawGetWindowHeight());
                    draw2dLine (Vec3(m+(f*p), v-2, 0), Vec3(w-m, v-1, 0), gGreen, drawGetWindowWidth(), drawGetWindowHeight());
                }
                // speedometer: horizontal line with length proportional to speed
                draw2dLine (Vec3 (m, v, 0), Vec3 (m + (f * s), v, 0), gWhite, drawGetWindowWidth(), drawGetWindowHeight());
                // min and max tick marks
                draw2dLine (Vec3 (m,       v, 0), Vec3 (m,      v-2, 0), gWhite, drawGetWindowWidth(), drawGetWindowHeight());
                draw2dLine (Vec3 (w-m,     v, 0), Vec3 (w-m,    v-2, 0), gWhite, drawGetWindowWidth(), drawGetWindowHeight());
            }
        }